

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  PolicyStatus PVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  cmState *this_00;
  cmGlobalGenerator *pcVar12;
  long lVar13;
  cmTarget *pcVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  PolicyID id;
  MessageType t;
  TargetType type;
  string *psVar15;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  string libType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&libType);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_00352f6a;
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&e,"BUILD_SHARED_LIBS",(allocator *)&libType);
  pcVar10 = cmMakefile::GetDefinition(pcVar1,(string *)&e);
  bVar3 = cmSystemTools::IsOff(pcVar10);
  std::__cxx11::string::~string((string *)&e);
  type = SHARED_LIBRARY - bVar3;
  psVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar7 = false;
  bVar5 = false;
  bVar6 = false;
  bVar2 = false;
  bVar3 = false;
  __first._M_current = psVar15;
  while (__first._M_current = __first._M_current + 1,
        __first._M_current !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&libType,(string *)__first._M_current);
    bVar4 = std::operator==(&libType,"STATIC");
    if (bVar4) {
      bVar5 = true;
      bVar4 = type != INTERFACE_LIBRARY;
      type = STATIC_LIBRARY;
      if (bVar4) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting STATIC type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
LAB_003531f3:
      std::__cxx11::string::~string((string *)&srclists);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      psVar15 = &libType;
      goto LAB_0035320c;
    }
    bVar4 = std::operator==(&libType,"SHARED");
    if (bVar4) {
      bVar5 = true;
      bVar4 = type != INTERFACE_LIBRARY;
      type = SHARED_LIBRARY;
      if (bVar4) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting SHARED type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(&libType,"MODULE");
    if (bVar4) {
      bVar5 = true;
      bVar4 = type != INTERFACE_LIBRARY;
      type = MODULE_LIBRARY;
      if (bVar4) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting MODULE type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(&libType,"OBJECT");
    if (bVar4) {
      bVar5 = true;
      bVar4 = type != INTERFACE_LIBRARY;
      type = OBJECT_LIBRARY;
      if (bVar4) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting OBJECT type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(&libType,"UNKNOWN");
    if (bVar4) {
      bVar5 = true;
      bVar4 = type != INTERFACE_LIBRARY;
      type = UNKNOWN_LIBRARY;
      if (bVar4) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting UNKNOWN type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(&libType,"ALIAS");
    if (bVar4) {
      bVar6 = true;
      if (type != INTERFACE_LIBRARY) goto LAB_00352f36;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting ALIAS type.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(&libType,"INTERFACE");
    if (bVar4) {
      if (bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting/multiple types."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      else if (bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library specified with conflicting ALIAS type.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      else {
        bVar5 = true;
        type = INTERFACE_LIBRARY;
        if (!bVar3) goto LAB_00352f36;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
      }
      goto LAB_003531f3;
    }
    bVar4 = std::operator==(__first._M_current,"EXCLUDE_FROM_ALL");
    if (bVar4) {
      bVar3 = true;
      if (type == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,"INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
        goto LAB_003531f3;
      }
    }
    else {
      bVar4 = std::operator==(__first._M_current,"IMPORTED");
      if (bVar4) {
        bVar2 = true;
      }
      else {
        if ((!bVar2) || (bVar4 = std::operator==(__first._M_current,"GLOBAL"), !bVar4)) {
          if ((type == INTERFACE_LIBRARY) &&
             (bVar4 = std::operator==(__first._M_current,"GLOBAL"), bVar4)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            std::operator<<((ostream *)&e,"GLOBAL option may only be used with IMPORTED libraries.")
            ;
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&srclists);
            goto LAB_003531f3;
          }
          std::__cxx11::string::~string((string *)&libType);
          break;
        }
        bVar7 = true;
      }
    }
LAB_00352f36:
    std::__cxx11::string::~string((string *)&libType);
  }
  if (type == INTERFACE_LIBRARY) {
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if ((!bVar7) || (bVar2)) goto LAB_003532f0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"INTERFACE library requires no source arguments.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
    }
  }
  else {
LAB_003532f0:
    bVar4 = cmGeneratorExpression::IsValidTargetName(psVar15);
    if (((!bVar4) || (bVar4 = cmGlobalGenerator::IsReservedTarget(psVar15), bVar4)) ||
       ((!bVar2 &&
        ((!bVar6 && (lVar13 = std::__cxx11::string::find((char)psVar15,0x3a), lVar13 != -1)))))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
      if (PVar8 - NEW < 3) {
        t = FATAL_ERROR;
        bVar4 = true;
LAB_0035333c:
        poVar11 = std::operator<<((ostream *)&e,"The target name \"");
        poVar11 = std::operator<<(poVar11,(string *)psVar15);
        std::operator<<(poVar11,
                        "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                       );
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,t,&libType);
        std::__cxx11::string::~string((string *)&libType);
        if (bVar4) goto LAB_003533a1;
      }
      else if ((PVar8 == WARN) && (type != INTERFACE_LIBRARY)) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&libType,(cmPolicies *)0x25,id);
        poVar11 = std::operator<<((ostream *)&e,(string *)&libType);
        std::operator<<(poVar11,"\n");
        std::__cxx11::string::~string((string *)&libType);
        bVar4 = false;
        t = AUTHOR_WARNING;
        goto LAB_0035333c;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    if (!bVar6) {
      if ((bVar2) && (bVar3 != false)) {
        std::__cxx11::string::string
                  ((string *)&e,"excludeFromAll with IMPORTED target makes no sense.",
                   (allocator *)&libType);
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
        goto LAB_00352f6a;
      }
      if ((type & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        std::__cxx11::string::string
                  ((string *)&e,"TARGET_SUPPORTS_SHARED_LIBS",(allocator *)&libType);
        bVar6 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (bVar6) goto LAB_003534a6;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar11 = std::operator<<((ostream *)&e,"ADD_LIBRARY called with ");
        pcVar10 = "MODULE";
        if (type == SHARED_LIBRARY) {
          pcVar10 = "SHARED";
        }
        poVar11 = std::operator<<(poVar11,pcVar10);
        std::operator<<(poVar11,
                        " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                       );
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&libType);
        std::__cxx11::string::~string((string *)&libType);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        type = STATIC_LIBRARY;
        if (bVar2) goto LAB_0035369f;
      }
      else {
LAB_003534a6:
        if (bVar2) {
LAB_0035369f:
          if (!bVar5) {
            std::__cxx11::string::string
                      ((string *)&e,"called with IMPORTED argument but no library type.",
                       (allocator *)&libType);
            cmCommand::SetError(&this->super_cmCommand,(string *)&e);
            goto LAB_00352f6a;
          }
          if (type == INTERFACE_LIBRARY) {
            bVar3 = cmGeneratorExpression::IsValidTargetName(psVar15);
            if (!bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar11 = std::operator<<((ostream *)&e,
                                        "Invalid name for IMPORTED INTERFACE library target: ");
              std::operator<<(poVar11,(string *)psVar15);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&libType);
              goto LAB_003532cf;
            }
          }
          else if (type == OBJECT_LIBRARY) {
            _e = (pointer)local_198;
            local_198[0]._M_local_buf[0] = '\0';
            pcVar12 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
            iVar9 = (*pcVar12->_vptr_cmGlobalGenerator[0x20])(pcVar12,&e);
            if ((char)iVar9 == '\0') {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &srclists,
                             "The OBJECT library type may not be used for IMPORTED libraries",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e
                            );
              std::operator+(&libType,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&srclists,".");
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&libType);
              std::__cxx11::string::~string((string *)&libType);
              std::__cxx11::string::~string((string *)&srclists);
LAB_003534e9:
              std::__cxx11::string::~string((string *)&e);
              return true;
            }
            std::__cxx11::string::~string((string *)&e);
          }
          pcVar14 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,psVar15,false);
          if (pcVar14 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget((this->super_cmCommand).Makefile,psVar15,type,bVar7);
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"cannot create imported target \"");
          poVar11 = std::operator<<(poVar11,(string *)psVar15);
          std::operator<<(poVar11,"\" because another target with the same name already exists.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
          goto LAB_003532cf;
        }
        if (type == UNKNOWN_LIBRARY) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string
                    ((string *)&e,
                     "The UNKNOWN library type may be used only for IMPORTED libraries.",
                     (allocator *)&libType);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
          goto LAB_003534e9;
        }
      }
      _e = (pointer)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      bVar7 = cmMakefile::EnforceUniqueName
                        ((this->super_cmCommand).Makefile,psVar15,(string *)&e,false);
      if (!bVar7) {
        cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_00352f6a:
        psVar15 = (string *)&e;
LAB_0035320c:
        std::__cxx11::string::~string((string *)psVar15);
        return false;
      }
      std::__cxx11::string::~string((string *)&e);
      srclists.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      srclists.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      srclists.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (type == INTERFACE_LIBRARY) {
        bVar7 = cmGeneratorExpression::IsValidTargetName(psVar15);
        if ((!bVar7) ||
           (lVar13 = std::__cxx11::string::find((char *)psVar15,0x562084), lVar13 != -1)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"Invalid name for INTERFACE library target: ");
          std::operator<<(poVar11,(string *)psVar15);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
          std::__cxx11::string::~string((string *)&libType);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          bVar7 = false;
          goto LAB_00353b0c;
        }
        type = INTERFACE_LIBRARY;
      }
      else {
        __last._M_current =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current == __last._M_current) {
          std::__cxx11::string::string
                    ((string *)&e,"You have called ADD_LIBRARY for library ",(allocator *)&libType);
          std::__cxx11::string::append((string *)&e);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::append((char *)&e);
          cmSystemTools::Message(_e,"Warning");
          std::__cxx11::string::~string((string *)&e);
          __last._M_current =
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srclists,
                   (const_iterator)
                   srclists.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__first,__last);
      }
      bVar7 = true;
      cmMakefile::AddLibrary((this->super_cmCommand).Makefile,psVar15,type,&srclists,bVar3);
LAB_00353b0c:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&srclists);
      return bVar7;
    }
    bVar5 = cmGeneratorExpression::IsValidTargetName(psVar15);
    if (!bVar5) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                     "Invalid name for ALIAS: ",psVar15);
      cmCommand::SetError(&this->super_cmCommand,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
      goto LAB_00352f6a;
    }
    if (bVar3 != false) {
      std::__cxx11::string::string
                ((string *)&e,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",(allocator *)&libType);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_00352f6a;
    }
    if ((bVar2) || (bVar7 != false)) {
      std::__cxx11::string::string
                ((string *)&e,"IMPORTED with ALIAS is not allowed.",(allocator *)&libType);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      goto LAB_00352f6a;
    }
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pcVar10 = ((__first._M_current)->_M_dataplus)._M_p;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&e,pcVar10,(allocator *)&libType);
      bVar3 = cmMakefile::IsAlias(pcVar1,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar11 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
        poVar11 = std::operator<<(poVar11,(string *)psVar15);
        poVar11 = std::operator<<(poVar11,"\" because target \"");
        poVar11 = std::operator<<(poVar11,pcVar10);
        std::operator<<(poVar11,"\" is itself an ALIAS.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&libType);
      }
      else {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string((string *)&e,pcVar10,(allocator *)&libType);
        pcVar14 = cmMakefile::FindTargetToUse(pcVar1,(string *)&e,true);
        std::__cxx11::string::~string((string *)&e);
        if (pcVar14 == (cmTarget *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar11 = std::operator<<(poVar11,(string *)psVar15);
          poVar11 = std::operator<<(poVar11,"\" because target \"");
          poVar11 = std::operator<<(poVar11,pcVar10);
          std::operator<<(poVar11,"\" does not already exist.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
        }
        else if ((pcVar14->TargetTypeValue < UNKNOWN_LIBRARY) &&
                ((0x9eU >> (pcVar14->TargetTypeValue & 0x1f) & 1) != 0)) {
          if (pcVar14->IsImportedTarget != true) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string((string *)&e,pcVar10,(allocator *)&libType);
            cmMakefile::AddAlias(pcVar1,psVar15,(string *)&e);
            goto LAB_003534e9;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar11 = std::operator<<(poVar11,(string *)psVar15);
          poVar11 = std::operator<<(poVar11,"\" because target \"");
          poVar11 = std::operator<<(poVar11,pcVar10);
          std::operator<<(poVar11,"\" is IMPORTED.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar11 = std::operator<<((ostream *)&e,"cannot create ALIAS target \"");
          poVar11 = std::operator<<(poVar11,(string *)psVar15);
          poVar11 = std::operator<<(poVar11,"\" because target \"");
          poVar11 = std::operator<<(poVar11,pcVar10);
          std::operator<<(poVar11,"\" is not a library.");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&libType);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      std::operator<<((ostream *)&e,"ALIAS requires exactly one target argument.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&libType);
    }
  }
LAB_003532cf:
  std::__cxx11::string::~string((string *)&libType);
LAB_003533a1:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        if (type != cmStateEnums::INTERFACE_LIBRARY) {
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
          issueMessage = true;
        }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "The target name \"" << libName
        << "\" is reserved or not valid for certain "
           "CMake features, such as generator expressions, and may result "
           "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  if (s == args.end()) {
    std::string msg = "You have called ADD_LIBRARY for library ";
    msg += args[0];
    msg += " without any source files. This typically indicates a problem ";
    msg += "with your CMakeLists.txt file";
    cmSystemTools::Message(msg.c_str(), "Warning");
  }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}